

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5TripCursors(Fts5FullTable *pTab)

{
  Fts5Cursor *local_18;
  Fts5Cursor *pCsr;
  Fts5FullTable *pTab_local;
  
  for (local_18 = pTab->pGlobal->pCsr; local_18 != (Fts5Cursor *)0x0; local_18 = local_18->pNext) {
    if ((local_18->ePlan == 1) && ((Fts5FullTable *)(local_18->base).pVtab == pTab)) {
      local_18->csrflags = local_18->csrflags | 0x20;
    }
  }
  return;
}

Assistant:

static void fts5TripCursors(Fts5FullTable *pTab){
  Fts5Cursor *pCsr;
  for(pCsr=pTab->pGlobal->pCsr; pCsr; pCsr=pCsr->pNext){
    if( pCsr->ePlan==FTS5_PLAN_MATCH
     && pCsr->base.pVtab==(sqlite3_vtab*)pTab 
    ){
      CsrFlagSet(pCsr, FTS5CSR_REQUIRE_RESEEK);
    }
  }
}